

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O0

iterator_filter<ezy::detail::iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:709:24)_&>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:710:22)_&>
* __thiscall
ezy::detail::
iterator_filter<ezy::detail::iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/tests/iterable_feature.cc:709:24)_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/tests/iterable_feature.cc:710:22)_&>
::operator++(iterator_filter<ezy::detail::iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:709:24)_&>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:710:22)_&>
             *this)

{
  __31 *this_00;
  bool bVar1;
  result_type i;
  iterator_filter<ezy::detail::iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:709:24)_&>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:710:22)_&>
  *this_local;
  
  iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/tests/iterable_feature.cc:709:24)_&>
  ::operator++(&this->orig);
  while( true ) {
    bVar1 = basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
            ::operator!=((basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                          *)this,&(this->end_iterator).
                                  super_basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        );
    if (!bVar1) {
      return this;
    }
    this_00 = (__31 *)this->predicate;
    i = iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/tests/iterable_feature.cc:709:24)_&>
        ::operator*(&this->orig);
    bVar1 = ____C_A_T_C_H____T_E_S_T____0()::$_31::operator()(this_00,i);
    if (bVar1) break;
    iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/tests/iterable_feature.cc:709:24)_&>
    ::operator++(&this->orig);
  }
  return this;
}

Assistant:

inline iterator_filter& operator++()
      {
        ++orig;
        for (; orig != end_iterator; ++orig)
          if (predicate(*orig))
            return *this;

        return *this;
      }